

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O2

void __thiscall TypeOpInsert::TypeOpInsert(TypeOpInsert *this,TypeFactory *t)

{
  OpBehavior *pOVar1;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"INSERT",&local_31);
  TypeOpFunc::TypeOpFunc(&this->super_TypeOpFunc,t,CPUI_INSERT,&local_30,TYPE_UNKNOWN,TYPE_INT);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_TypeOpFunc).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_003f38d0;
  (this->super_TypeOpFunc).super_TypeOp.opflags = 0x20000;
  pOVar1 = (OpBehavior *)operator_new(0x10);
  pOVar1->_vptr_OpBehavior = (_func_int **)&PTR__OpBehavior_003fe0a0;
  pOVar1->opcode = CPUI_INSERT;
  pOVar1->isunary = false;
  pOVar1->isspecial = true;
  (this->super_TypeOpFunc).super_TypeOp.behave = pOVar1;
  return;
}

Assistant:

TypeOpInsert::TypeOpInsert(TypeFactory *t)
  : TypeOpFunc(t,CPUI_INSERT,"INSERT",TYPE_UNKNOWN,TYPE_INT)
{
  opflags = PcodeOp::special;
  behave = new OpBehavior(CPUI_INSERT,false,true);	// Dummy behavior
}